

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar.cpp
# Opt level: O2

HaarWavelet * __thiscall imagestego::impl::HaarWavelet::inverse(HaarWavelet *this,Mat *mat)

{
  undefined8 uVar1;
  pointer pMVar2;
  pointer pfVar3;
  pointer pMVar4;
  pointer pfVar5;
  undefined1 local_111 [9];
  vector<cv::Mat,_std::allocator<cv::Mat>_> _planes;
  vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> futures;
  vector<cv::Mat,_std::allocator<cv::Mat>_> planes;
  pointer local_a8;
  HaarWavelet *local_a0;
  Size local_98;
  _InputArray local_90 [4];
  
  cv::Mat::Mat((Mat *)this);
  planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  futures.super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&_planes;
  _planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_90[0].sz.width = 0;
  local_90[0].sz.height = 0;
  local_90[0].flags = 0x1010000;
  futures.super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  _planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  _planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  futures.super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(futures.
                         super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2050000);
  cv::split(local_90,(_OutputArray *)&futures);
  futures.super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  futures.super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  futures.super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_111._1_8_ = this;
  std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>::reserve
            (&futures,((long)_planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)_planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x60);
  pMVar2 = _planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar4 = _planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_start; pMVar4 != pMVar2; pMVar4 = pMVar4 + 0x60) {
    local_a8 = pMVar4;
    std::
    async<imagestego::impl::HaarWavelet::inverse(cv::Mat_const&)::_lambda(cv::Mat_const&)_1_,std::reference_wrapper<cv::Mat_const>>
              ((anon_class_1_0_00000001_for__M_head_impl *)local_90,
               (reference_wrapper<const_cv::Mat> *)local_111);
    std::vector<std::future<cv::Mat>,std::allocator<std::future<cv::Mat>>>::
    emplace_back<std::future<cv::Mat>>
              ((vector<std::future<cv::Mat>,std::allocator<std::future<cv::Mat>>> *)&futures,
               (future<cv::Mat> *)local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90[0].obj);
  }
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::reserve
            (&planes,((long)_planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)_planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                           super__Vector_impl_data._M_start) / 0x60);
  pfVar3 = futures.super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar1 = local_111._1_8_;
  for (pfVar5 = futures.
                super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>.
                _M_impl.super__Vector_impl_data._M_start; pfVar5 != pfVar3; pfVar5 = pfVar5 + 1) {
    std::future<cv::Mat>::get((future<cv::Mat> *)local_90);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>(&planes,(Mat *)local_90);
    cv::Mat::~Mat((Mat *)local_90);
  }
  local_90[0].sz.width = 0;
  local_90[0].sz.height = 0;
  local_98.width = 0;
  local_98.height = 0;
  local_90[0].flags = 0x1050000;
  local_a8 = (pointer)CONCAT44(local_a8._4_4_,0x2010000);
  local_a0 = (HaarWavelet *)uVar1;
  local_90[0].obj = &planes;
  cv::merge(local_90,(_OutputArray *)&local_a8);
  std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>::~vector(&futures);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&_planes);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&planes);
  return (HaarWavelet *)uVar1;
}

Assistant:

cv::Mat inverse(const cv::Mat& mat) {
        cv::Mat dst;
        std::vector<cv::Mat> planes, _planes;
        cv::split(mat, _planes);
        std::vector<std::future<cv::Mat>> futures;
        futures.reserve(_planes.size());
        for (const cv::Mat& mat_ : _planes) {
            futures.emplace_back(std::async(
                [](const cv::Mat& src) {
                    return inverseHorizontalLifting(inverseVerticalLifting(src));
                },
                std::cref(mat_)));
        }
        planes.reserve(_planes.size());
        for (auto&& f : futures) {
            planes.emplace_back(f.get());
        }
        cv::merge(planes, dst);
        return dst;
    }